

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_GetSegwitAddressByHash_Test::~AddressFactory_GetSegwitAddressByHash_Test
          (AddressFactory_GetSegwitAddressByHash_Test *this)

{
  void *in_RDI;
  
  ~AddressFactory_GetSegwitAddressByHash_Test
            ((AddressFactory_GetSegwitAddressByHash_Test *)0x1a5f48);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(AddressFactory, GetSegwitAddressByHash)
{
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.GetSegwitAddressByHash(ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);

    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData()), CfdException);
    EXPECT_THROW(factory.GetSegwitAddressByHash(ByteData("0000")), CfdException);
  }
}